

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tester.cc
# Opt level: O0

bool re2::ResultOkay(Result *r,Result *correct)

{
  int iVar1;
  int iVar2;
  iterator pcVar3;
  iterator pcVar4;
  int local_24;
  int i;
  Result *correct_local;
  Result *r_local;
  
  if ((r->skipped & 1U) == 0) {
    if ((r->matched & 1U) == (correct->matched & 1U)) {
      if (((r->have_submatch & 1U) != 0) || ((r->have_submatch0 & 1U) != 0)) {
        for (local_24 = 0; local_24 < 0x11; local_24 = local_24 + 1) {
          pcVar3 = StringPiece::begin(correct->submatch + local_24);
          pcVar4 = StringPiece::begin(r->submatch + local_24);
          if (pcVar3 != pcVar4) {
            return false;
          }
          iVar1 = StringPiece::size(correct->submatch + local_24);
          iVar2 = StringPiece::size(r->submatch + local_24);
          if (iVar1 != iVar2) {
            return false;
          }
          if ((r->have_submatch & 1U) == 0) break;
        }
      }
      r_local._7_1_ = true;
    }
    else {
      r_local._7_1_ = false;
    }
  }
  else {
    r_local._7_1_ = true;
  }
  return r_local._7_1_;
}

Assistant:

static bool ResultOkay(const Result& r, const Result& correct) {
  if (r.skipped)
    return true;
  if (r.matched != correct.matched)
    return false;
  if (r.have_submatch || r.have_submatch0) {
    for (int i = 0; i < kMaxSubmatch; i++) {
      if (correct.submatch[i].begin() != r.submatch[i].begin() ||
          correct.submatch[i].size() != r.submatch[i].size())
        return false;
      if (!r.have_submatch)
        break;
    }
  }
  return true;
}